

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

void __thiscall
IntrusiveListTest_swap_Test::~IntrusiveListTest_swap_Test(IntrusiveListTest_swap_Test *this)

{
  IntrusiveListTest_swap_Test *this_local;
  
  ~IntrusiveListTest_swap_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(IntrusiveListTest, swap) {
  TestObjectList list1 = NewList({1, 2, 3, 4});

  TestObjectList list2 = NewList({100, 200, 300});

  AssertListEq(list1, {1, 2, 3, 4});
  AssertListEq(list2, {100, 200, 300});

  list1.swap(list2);

  AssertListEq(list1, {100, 200, 300});
  AssertListEq(list2, {1, 2, 3, 4});
}